

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O3

void Abc_NtkDontCareWinSweepLeafTfo_rec(Abc_Obj_t *pObj,int nLevelLimit,Abc_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  int Fill;
  long lVar5;
  
  if (((*(uint *)&pObj->field_0x14 & 0xf) - 5 < 0xfffffffe) &&
     (pObj != pNode && (int)(*(uint *)&pObj->field_0x14 >> 0xc) <= nLevelLimit)) {
    pAVar3 = pObj->pNtk;
    iVar1 = pObj->Id;
    Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,(int)pNode);
    if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pAVar4 = pObj->pNtk;
    iVar2 = pAVar4->nTravIds;
    if ((pAVar3->vTravIds).pArray[iVar1] != iVar2) {
      iVar1 = pObj->Id;
      Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
      if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar4->vTravIds).pArray[iVar1] = iVar2;
      if ((pObj->vFanouts).nSize - 1U < 100) {
        lVar5 = 0;
        do {
          Abc_NtkDontCareWinSweepLeafTfo_rec
                    ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar5]],
                     nLevelLimit,pNode);
          lVar5 = lVar5 + 1;
        } while (lVar5 < (pObj->vFanouts).nSize);
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkDontCareWinSweepLeafTfo_rec( Abc_Obj_t * pObj, int nLevelLimit, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanout;
    int i;
    if ( Abc_ObjIsCo(pObj) || (int)pObj->Level > nLevelLimit || pObj == pNode )
        return;
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    ////////////////////////////////////////
    // try to reduce the runtime
    if ( Abc_ObjFanoutNum(pObj) > 100 )
        return;
    ////////////////////////////////////////
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Abc_NtkDontCareWinSweepLeafTfo_rec( pFanout, nLevelLimit, pNode );
}